

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

void HUF_simpleQuickSort(nodeElt *arr,int low,int high)

{
  nodeElt nVar1;
  int iVar2;
  bool bVar3;
  int idx;
  int kInsertionSortThreshold;
  int high_local;
  int low_local;
  nodeElt *arr_local;
  uint uStack_28;
  int j;
  nodeElt key;
  int size;
  int i;
  
  idx = high;
  kInsertionSortThreshold = low;
  if (high - low < 8) {
    key.parent = 1;
    key.byte = '\0';
    key.nbBits = '\0';
    for (; (int)key._4_4_ < (high - low) + 1; key._4_4_ = key._4_4_ + 1) {
      nVar1 = arr[(long)low + (long)(int)key._4_4_];
      iVar2 = key._4_4_;
      while( true ) {
        arr_local._4_4_ = iVar2 + -1;
        bVar3 = false;
        if (-1 < arr_local._4_4_) {
          uStack_28 = nVar1.count;
          bVar3 = arr[(long)low + (long)arr_local._4_4_].count < uStack_28;
        }
        if (!bVar3) break;
        arr[(long)low + (long)iVar2] = arr[(long)low + (long)arr_local._4_4_];
        iVar2 = arr_local._4_4_;
      }
      arr[(long)low + (long)iVar2] = nVar1;
    }
  }
  else {
    while (kInsertionSortThreshold < idx) {
      iVar2 = HUF_quickSortPartition(arr,kInsertionSortThreshold,idx);
      if (iVar2 - kInsertionSortThreshold < idx - iVar2) {
        HUF_simpleQuickSort(arr,kInsertionSortThreshold,iVar2 + -1);
        kInsertionSortThreshold = iVar2 + 1;
      }
      else {
        HUF_simpleQuickSort(arr,iVar2 + 1,idx);
        idx = iVar2 + -1;
      }
    }
  }
  return;
}

Assistant:

static void HUF_simpleQuickSort(nodeElt arr[], int low, int high) {
    int const kInsertionSortThreshold = 8;
    if (high - low < kInsertionSortThreshold) {
        HUF_insertionSort(arr, low, high);
        return;
    }
    while (low < high) {
        int const idx = HUF_quickSortPartition(arr, low, high);
        if (idx - low < high - idx) {
            HUF_simpleQuickSort(arr, low, idx - 1);
            low = idx + 1;
        } else {
            HUF_simpleQuickSort(arr, idx + 1, high);
            high = idx - 1;
        }
    }
}